

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

int __thiscall Fl_Tree_Item::swap_children(Fl_Tree_Item *this,Fl_Tree_Item *a,Fl_Tree_Item *b)

{
  Fl_Tree_Item **ppFVar1;
  Fl_Tree_Item *pFVar2;
  int iVar3;
  int iVar4;
  int t;
  int iVar5;
  long lVar6;
  int iVar7;
  
  ppFVar1 = (this->_children)._items;
  iVar7 = -1;
  iVar4 = -1;
  for (lVar6 = 0; lVar6 < (this->_children)._total; lVar6 = lVar6 + 1) {
    iVar5 = (int)lVar6;
    if (ppFVar1[lVar6] == a) {
      iVar4 = iVar5;
      if (iVar7 != -1) break;
      iVar7 = -1;
      iVar3 = iVar5;
    }
    else {
      iVar3 = iVar4;
      if ((ppFVar1[lVar6] == b) && (iVar7 = iVar5, iVar3 = -1, iVar4 != -1)) break;
    }
    iVar4 = iVar3;
  }
  if (iVar7 == -1 || iVar4 == -1) {
    iVar7 = -1;
  }
  else {
    pFVar2 = ppFVar1[iVar4];
    ppFVar1[iVar4] = ppFVar1[iVar7];
    (this->_children)._items[iVar7] = pFVar2;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int Fl_Tree_Item::swap_children(Fl_Tree_Item *a, Fl_Tree_Item *b) {
  int ax = -1, bx = -1;
  for ( int t=0; t<children(); t++ ) {	// find index for a and b
    if ( _children[t] == a ) { ax = t; if ( bx != -1 ) break; else continue; }
    if ( _children[t] == b ) { bx = t; if ( ax != -1 ) break; else continue; }
  }
  if ( ax == -1 || bx == -1 ) return(-1);	// not found? fail
  swap_children(ax,bx);
  return(0);
}